

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplace_back<slang::IntervalMapDetails::LeafNode<int,int,16u,true>*&,unsigned_int&,unsigned_int&>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,
          LeafNode<int,_int,_16U,_true> **args,uint *args_1,uint *args_2)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  ulong uVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  pointer pEVar9;
  pointer pEVar10;
  pointer pEVar11;
  pointer pEVar12;
  long lVar13;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *pEVar14;
  pointer pEVar15;
  
  pEVar12 = this->data_;
  sVar3 = this->len;
  pEVar15 = pEVar12 + sVar3;
  if (sVar3 != this->cap) {
    uVar1 = *args_1;
    uVar2 = *args_2;
    pEVar15->node = *args;
    pEVar15->size = uVar1;
    pEVar15->offset = uVar2;
    this->len = sVar3 + 1;
    return pEVar12 + sVar3;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar14 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar4 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar4 * 2);
  if (pEVar14 < ctx) {
    pEVar14 = ctx;
  }
  if (0x7ffffffffffffff - uVar4 < uVar4) {
    pEVar14 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar13 = (long)pEVar15 - (long)this->data_;
  pEVar9 = (pointer)operator_new((long)pEVar14 << 4);
  uVar1 = *args_1;
  uVar2 = *args_2;
  *(LeafNode<int,_int,_16U,_true> **)((long)pEVar9 + lVar13) = *args;
  *(uint *)((long)pEVar9 + lVar13 + 8) = uVar1;
  *(uint *)((long)pEVar9 + lVar13 + 0xc) = uVar2;
  pEVar12 = this->data_;
  pEVar10 = pEVar12 + this->len;
  pEVar11 = pEVar9;
  if (pEVar10 == pEVar15) {
    for (; pEVar12 != pEVar15; pEVar12 = pEVar12 + 1) {
      uVar7 = pEVar12->size;
      uVar8 = pEVar12->offset;
      pEVar11->node = pEVar12->node;
      pEVar11->size = uVar7;
      pEVar11->offset = uVar8;
      pEVar11 = pEVar11 + 1;
    }
  }
  else {
    for (; pEVar12 != pEVar15; pEVar12 = pEVar12 + 1) {
      uVar7 = pEVar12->size;
      uVar8 = pEVar12->offset;
      pEVar11->node = pEVar12->node;
      pEVar11->size = uVar7;
      pEVar11->offset = uVar8;
      pEVar11 = pEVar11 + 1;
    }
    puVar5 = (undefined8 *)((long)pEVar9 + lVar13);
    for (; pEVar15 != pEVar10; pEVar15 = pEVar15 + 1) {
      uVar6 = *(undefined8 *)&pEVar15->size;
      puVar5[2] = pEVar15->node;
      puVar5[3] = uVar6;
      puVar5 = puVar5 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar14;
  this->data_ = pEVar9;
  return (reference)((long)pEVar9 + lVar13);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }